

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  byte bVar1;
  int iVar2;
  xmlEntityPtr pxVar3;
  xmlHashTablePtr table;
  uint uVar4;
  xmlDictPtr dict;
  xmlChar ref_1 [4];
  xmlChar ref [4];
  uint local_38;
  xmlChar local_34;
  char cStack_33;
  undefined2 uStack_32;
  
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  if (dtd->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = dtd->doc->dict;
  }
  if (type - 1U < 3) {
    pxVar3 = xmlGetPredefinedEntity(name);
    if (pxVar3 != (xmlEntityPtr)0x0) {
      if (content == (xmlChar *)0x0 || type != 1) {
LAB_001458d0:
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(void *)0x0,2,0x68,XML_ERR_WARNING,(char *)0x0,0,(char *)name,(char *)0x0,
                        (char *)0x0,0,0,
                        "xmlAddEntity: invalid redeclaration of predefined entity \'%s\'",name,0);
        return (xmlEntityPtr)0x0;
      }
      bVar1 = *pxVar3->content;
      if ((((*content != bVar1) || (content[1] != '\0')) || (0x3e < bVar1)) ||
         ((0x4000008400000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        if ((*content != 0x26) || (content[1] != '#')) goto LAB_001458d0;
        if (content[2] == 'x') {
          _local_34 = CONCAT22(0x3b,CONCAT11("0123456789ABCDEF"[bVar1 & 0xf],
                                             "0123456789ABCDEF"[bVar1 >> 4]));
          iVar2 = xmlStrcasecmp(content + 3,&local_34);
          if (iVar2 != 0) goto LAB_001458d0;
        }
        else {
          uVar4 = bVar1 / 10;
          local_38 = CONCAT22(0x3b,CONCAT11(bVar1 + (bVar1 / 5 & 0xfe) * -5,
                                            (char)uVar4 + ((byte)(uVar4 / 5) & 6) * -5) | 0x30) |
                     0x3000;
          iVar2 = xmlStrEqual(content + 2,(xmlChar *)&local_38);
          if (iVar2 == 0) goto LAB_001458d0;
        }
      }
    }
    table = (xmlHashTablePtr)dtd->entities;
    if (table != (xmlHashTablePtr)0x0) goto LAB_00145879;
    table = xmlHashCreateDict(0,dict);
    dtd->entities = table;
  }
  else {
    if (1 < type - 4U) {
      return (xmlEntityPtr)0x0;
    }
    table = (xmlHashTablePtr)dtd->pentities;
    if (table != (xmlHashTablePtr)0x0) goto LAB_00145879;
    table = xmlHashCreateDict(0,dict);
    dtd->pentities = table;
  }
  if (table == (xmlHashTablePtr)0x0) {
    return (xmlEntityPtr)0x0;
  }
LAB_00145879:
  pxVar3 = xmlCreateEntity(dict,name,type,ExternalID,SystemID,content);
  if (pxVar3 != (xmlEntityPtr)0x0) {
    pxVar3->doc = dtd->doc;
    iVar2 = xmlHashAddEntry(table,name,pxVar3);
    if (iVar2 == 0) {
      return pxVar3;
    }
    xmlFreeEntity(pxVar3);
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

static xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content) {
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret, predef;

    if (name == NULL)
	return(NULL);
    if (dtd == NULL)
	return(NULL);
    if (dtd->doc != NULL)
        dict = dtd->doc->dict;

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
            predef = xmlGetPredefinedEntity(name);
            if (predef != NULL) {
                int valid = 0;

                /* 4.6 Predefined Entities */
                if ((type == XML_INTERNAL_GENERAL_ENTITY) &&
                    (content != NULL)) {
                    int c = predef->content[0];

                    if (((content[0] == c) && (content[1] == 0)) &&
                        ((c == '>') || (c == '\'') || (c == '"'))) {
                        valid = 1;
                    } else if ((content[0] == '&') && (content[1] == '#')) {
                        if (content[2] == 'x') {
                            xmlChar *hex = BAD_CAST "0123456789ABCDEF";
                            xmlChar ref[] = "00;";

                            ref[0] = hex[c / 16 % 16];
                            ref[1] = hex[c % 16];
                            if (xmlStrcasecmp(&content[3], ref) == 0)
                                valid = 1;
                        } else {
                            xmlChar ref[] = "00;";

                            ref[0] = '0' + c / 10 % 10;
                            ref[1] = '0' + c % 10;
                            if (xmlStrEqual(&content[2], ref))
                                valid = 1;
                        }
                    }
                }
                if (!valid) {
                    xmlEntitiesWarn(XML_ERR_ENTITY_PROCESSING,
                            "xmlAddEntity: invalid redeclaration of predefined"
                            " entity '%s'", name);
                    return(NULL);
                }
            }
	    if (dtd->entities == NULL)
		dtd->entities = xmlHashCreateDict(0, dict);
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL)
		dtd->pentities = xmlHashCreateDict(0, dict);
	    table = dtd->pentities;
	    break;
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return(NULL);
    }
    if (table == NULL)
	return(NULL);
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = dtd->doc;

    if (xmlHashAddEntry(table, name, ret)) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(NULL);
    }
    return(ret);
}